

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_initialize.c
# Opt level: O0

lu_int basiclu_initialize(lu_int m,lu_int *istore,double *xstore)

{
  long in_RDX;
  long in_RSI;
  int in_EDI;
  double *in_stack_000002b0;
  lu_int *in_stack_000002b8;
  lu_int in_stack_000002c4;
  undefined4 local_4;
  
  if ((in_RSI == 0) || (in_RDX == 0)) {
    local_4 = -3;
  }
  else if (in_EDI < 1) {
    local_4 = -4;
  }
  else {
    lu_initialize(in_stack_000002c4,in_stack_000002b8,in_stack_000002b0);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

lu_int basiclu_initialize
(
    lu_int m,
    lu_int istore[],
    double xstore[]
)
{
    if (!istore || !xstore)
        return BASICLU_ERROR_argument_missing;
    if (m <= 0)
        return BASICLU_ERROR_invalid_argument;

    lu_initialize(m, istore, xstore);
    return BASICLU_OK;
}